

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

void TextElementBegin(textwriter *Out,textwriter *In,tchar_t *Element)

{
  wchar_t local_34;
  wchar_t local_24;
  tchar_t *Element_local;
  textwriter *In_local;
  textwriter *Out_local;
  
  if (In->HasChild == 0) {
    In->HasChild = 1;
    if (In->InsideContent == 0) {
      TextWrite(In,">\n");
    }
    else {
      TextWrite(In,">");
    }
  }
  Out->CC = In->CC;
  Out->Stream = In->Stream;
  Out->HasChild = 0;
  Out->SafeFormat = In->SafeFormat;
  Out->InsideContent = (long)(int)(uint)(In->Deep == L'\0');
  if (In->InsideContent == 0) {
    local_24 = In->Deep + L'\x02';
  }
  else {
    local_24 = L'\0';
  }
  Out->Deep = local_24;
  Out->Element = Element;
  if (In->Deep == L'\0') {
    local_34 = L'\0';
  }
  else {
    local_34 = Out->Deep;
  }
  TextPrintf(Out,"%*c%s",(ulong)(uint)local_34,0x3c,Element);
  return;
}

Assistant:

void TextElementBegin(textwriter* Out, textwriter* In, const tchar_t* Element)
{
    if (!In->HasChild)
    {
        In->HasChild = 1;
        if (In->InsideContent)
            TextWrite(In,T(">"));
        else
            TextWrite(In,T(">\n"));
    }
    Out->CC = In->CC;
    Out->Stream = In->Stream;
    Out->HasChild = 0;
    Out->SafeFormat = In->SafeFormat;
    Out->InsideContent = In->Deep==0;
    Out->Deep = In->InsideContent ? 0 : In->Deep+2;
    Out->Element = Element;
    TextPrintf(Out,T("%*c%s"),In->Deep?Out->Deep:0, '<',Element);
}